

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer(int64_t i,Nonnull<char_*> buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint64_t uVar6;
  ulong local_d0;
  uint64_t u;
  Nonnull<char_*> buffer_local;
  int64_t i_local;
  uint64_t mod_result;
  uint64_t mid_result;
  uint32_t div08mod08;
  uint32_t div016;
  uint64_t div08_3;
  uint32_t div08_1;
  uint32_t mod08;
  char *local_80;
  uint64_t bottom_2;
  uint32_t mod08_2;
  uint32_t div08_2;
  uint32_t zeroes_1;
  uint64_t bottom_3;
  char *local_48;
  uint64_t bottom;
  uint32_t mod08_1;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  char *local_10;
  
  local_d0 = i;
  u = (uint64_t)buffer;
  if (i < 0) {
    u = (uint64_t)(buffer + 1);
    *buffer = '-';
    local_d0 = -i;
  }
  uVar5 = std::numeric_limits<unsigned_int>::max();
  if (uVar5 < local_d0) {
    if (local_d0 < 10000000000000000) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_d0;
      uVar5 = SUB164(auVar1 / ZEXT816(100000000),0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_d0;
      div08_3._4_4_ = SUB164(auVar2 % ZEXT816(100000000),0);
      if (uVar5 < 10) {
        *(char *)u = SUB161(auVar1 / ZEXT816(100000000),0) + '0';
        local_48 = (char *)(u + 1);
      }
      else if (uVar5 < 100000000) {
        uVar6 = anon_unknown_0::PrepareEightDigits(uVar5);
        if (uVar6 == 0) {
          __assert_fail("bottom != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                        ,0xf5,
                        "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                       );
        }
        uVar5 = countr_zero<unsigned_long>(uVar6);
        little_endian::Store64
                  ((Nonnull<void_*>)u,uVar6 + 0x3030303030303030 >> ((byte)uVar5 & 0x38));
        local_48 = (char *)((u + 8) - (ulong)(uVar5 >> 3));
      }
      else {
        uVar6 = anon_unknown_0::PrepareEightDigits(uVar5 % 100000000);
        local_48 = anon_unknown_0::EncodeHundred(uVar5 / 100000000,(Nonnull<char_*>)u);
        little_endian::Store64(local_48,uVar6 + 0x3030303030303030);
        local_48 = local_48 + 8;
      }
      _div08_1 = local_48;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_d0;
      div08_3._4_4_ = SUB164(auVar3 % ZEXT816(100000000),0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_d0 / 100000000;
      uVar6 = anon_unknown_0::PrepareEightDigits((uint32_t)((local_d0 / 100000000) % 100000000));
      _div08_1 = anon_unknown_0::EncodeTenThousand
                           (SUB164(auVar4 / ZEXT816(100000000),0),(Nonnull<char_*>)u);
      little_endian::Store64(_div08_1,uVar6 + 0x3030303030303030);
      _div08_1 = _div08_1 + 8;
    }
    uVar6 = anon_unknown_0::PrepareEightDigits(div08_3._4_4_);
    little_endian::Store64(_div08_1,uVar6 + 0x3030303030303030);
    local_80 = _div08_1 + 8;
  }
  else {
    uVar5 = (uint)local_d0;
    if (uVar5 < 10) {
      *(char *)u = (char)local_d0 + '0';
      local_10 = (char *)(u + 1);
    }
    else if (uVar5 < 100000000) {
      uVar6 = anon_unknown_0::PrepareEightDigits(uVar5);
      if (uVar6 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                      ,0xf5,
                      "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar5 = countr_zero<unsigned_long>(uVar6);
      little_endian::Store64((Nonnull<void_*>)u,uVar6 + 0x3030303030303030 >> ((byte)uVar5 & 0x38));
      local_10 = (char *)((u + 8) - (ulong)(uVar5 >> 3));
    }
    else {
      uVar6 = anon_unknown_0::PrepareEightDigits(uVar5 % 100000000);
      local_10 = anon_unknown_0::EncodeHundred(uVar5 / 100000000,(Nonnull<char_*>)u);
      little_endian::Store64(local_10,uVar6 + 0x3030303030303030);
      local_10 = local_10 + 8;
    }
    local_80 = local_10;
  }
  *local_80 = '\0';
  return local_80;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int64_t i, absl::Nonnull<char*> buffer) {
  uint64_t u = static_cast<uint64_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU64(u, buffer);
  *buffer = '\0';
  return buffer;
}